

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.cpp
# Opt level: O2

void __thiscall deqp::gls::LifetimeTests::details::LifeTest::testDeleteUsed(LifeTest *this)

{
  CallLogWrapper *this_00;
  RenderContext *pRVar1;
  GLboolean GVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TestError *this_01;
  ResultCollector errors;
  CheckedProgram program;
  CheckedShader fragShader;
  CheckedShader vtxShader;
  GLint deleteFlagged;
  ostringstream local_198 [376];
  
  errors.m_testCtx = (this->super_TestBase).super_TestCase.super_TestNode.m_testCtx;
  errors.m_log = (errors.m_testCtx)->m_log;
  errors.m_result = QP_TEST_RESULT_PASS;
  errors.m_message = "Pass";
  pRVar1 = (this->super_TestBase).m_ctx.m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deleteFlagged,
             "#version 100\nattribute vec2 pos; void main() { gl_Position = vec4(pos.xy, 0.0, 1.0); }\n"
             ,(allocator<char> *)&fragShader);
  CheckedShader::CheckedShader(&vtxShader,pRVar1,SHADERTYPE_VERTEX,(string *)&deleteFlagged);
  std::__cxx11::string::~string((string *)&deleteFlagged);
  pRVar1 = (this->super_TestBase).m_ctx.m_renderCtx;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&deleteFlagged,"#version 100\nvoid main() { gl_FragColor = vec4(1.0); }\n",
             (allocator<char> *)&program);
  CheckedShader::CheckedShader(&fragShader,pRVar1,SHADERTYPE_FRAGMENT,(string *)&deleteFlagged);
  std::__cxx11::string::~string((string *)&deleteFlagged);
  CheckedProgram::CheckedProgram
            (&program,(this->super_TestBase).m_ctx.m_renderCtx,vtxShader.super_Shader.m_shader,
             fragShader.super_Shader.m_shader);
  _deleteFlagged = (pointer)((this->super_TestBase).m_ctx.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"// Created and linked program ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&deleteFlagged,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  this_00 = &(this->super_TestBase).super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,program.super_Program.m_program);
  iVar4 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
  dVar5 = (**(code **)(CONCAT44(extraout_var,iVar4) + 0x800))();
  glu::checkError(dVar5,"glUseProgram(programId)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                  ,0x35c);
  _deleteFlagged = (pointer)((this->super_TestBase).m_ctx.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream(local_198);
  std::operator<<((ostream *)local_198,"// Deleted program ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&deleteFlagged,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  glu::Program::~Program(&program.super_Program);
  glu::Shader::~Shader(&fragShader.super_Shader);
  glu::Shader::~Shader(&vtxShader.super_Shader);
  GVar2 = glu::CallLogWrapper::glIsProgram(this_00,program.super_Program.m_program);
  if (GVar2 != '\0') {
    _deleteFlagged = _deleteFlagged & 0xffffffff00000000;
    glu::CallLogWrapper::glGetProgramiv
              (this_00,program.super_Program.m_program,0x8b80,&deleteFlagged);
    if (deleteFlagged == 0) {
      ResultCollector::fail(&errors,"Program object was not flagged as deleted");
    }
    glu::CallLogWrapper::glUseProgram(this_00,0);
    iVar4 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
    dVar5 = (**(code **)(CONCAT44(extraout_var_00,iVar4) + 0x800))();
    glu::checkError(dVar5,"glUseProgram(0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
                    ,0x367);
    iVar4 = (*((this->super_TestBase).m_ctx.m_renderCtx)->_vptr_RenderContext[3])();
    cVar3 = (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0xc90))(program.super_Program.m_program);
    if (cVar3 != '\0') {
      ResultCollector::fail(&errors,"Deleted program name still valid after being made non-current")
      ;
    }
    ResultCollector::~ResultCollector(&errors);
    return;
  }
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,(char *)0x0,"glIsProgram(programId)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsLifetimeTests.cpp"
             ,0x361);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LifeTest::testDeleteUsed (void)
{
	ResultCollector	errors(getTestContext());
	GLuint			programId = 0;

	{
		CheckedShader	vtxShader	(getRenderContext(),
									 SHADERTYPE_VERTEX, s_vertexShaderSrc);
		CheckedShader	fragShader	(getRenderContext(),
									 SHADERTYPE_FRAGMENT, s_fragmentShaderSrc);
		CheckedProgram	program		(getRenderContext(),
									 vtxShader.getShader(), fragShader.getShader());

		programId = program.getProgram();

		log() << TestLog::Message << "// Created and linked program " << programId
			  << TestLog::EndMessage;
		GLU_CHECK_CALL_ERROR(glUseProgram(programId), gl().getError());

		log() << TestLog::Message << "// Deleted program " << programId
			  << TestLog::EndMessage;
	}
	TCU_CHECK(glIsProgram(programId));
	{
		GLint deleteFlagged = 0;
		glGetProgramiv(programId, GL_DELETE_STATUS, &deleteFlagged);
		errors.check(deleteFlagged != 0, "Program object was not flagged as deleted");
	}
	GLU_CHECK_CALL_ERROR(glUseProgram(0), gl().getError());
	errors.check(!gl().isProgram(programId),
				 "Deleted program name still valid after being made non-current");
}